

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

void upb_Status_VAppendErrorFormat(upb_Status *status,char *fmt,__va_list_tag *args)

{
  size_t sVar1;
  
  if (status != (upb_Status *)0x0) {
    status->ok = false;
    sVar1 = strlen(status->msg);
    vsnprintf(status->msg + sVar1,0x1ff - sVar1,fmt,args);
    status->msg[0x1fe] = '\0';
  }
  return;
}

Assistant:

void upb_Status_VAppendErrorFormat(upb_Status* status, const char* fmt,
                                   va_list args) {
  size_t len;
  if (!status) return;
  status->ok = false;
  len = strlen(status->msg);
  vsnprintf(status->msg + len, sizeof(status->msg) - len, fmt, args);
  status->msg[_kUpb_Status_MaxMessage - 1] = '\0';
}